

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void update_perf_tbl_with_bapcod_json_perf_data
               (AppCtx *ctx,PerfProfRunHandle *handle,char *json_filepath)

{
  cJSON *root;
  PerfProfRun run;
  PerfProfRun PStack_68;
  
  make_solver_run(&PStack_68,ctx->current_batch,handle->solver_name);
  if (json_filepath != (char *)0x0) {
    root = load_json(json_filepath);
    if (root != (cJSON *)0x0) {
      parse_bapcod_solver_json_dump(&PStack_68,root);
      cJSON_Delete(root);
    }
  }
  store_perfprof_run(&ctx->perf_tbl,&(handle->input).uid,&PStack_68);
  return;
}

Assistant:

static void update_perf_tbl_with_bapcod_json_perf_data(
    AppCtx *ctx, PerfProfRunHandle *handle, char *json_filepath) {
    PerfProfRun run = make_solver_run(ctx->current_batch, handle->solver_name);
    if (json_filepath) {
        cJSON *root = load_json(json_filepath);
        if (root) {
            parse_bapcod_solver_json_dump(&run, root);
            cJSON_Delete(root);
        }
    }
    store_perfprof_run(&ctx->perf_tbl, &handle->input.uid, &run);
}